

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.h
# Opt level: O0

double v2n(Value val)

{
  anon_union_8_2_43acf83c convert;
  Value val_local;
  
  return (double)val;
}

Assistant:

static inline double v2n(Value val) {
	// Use a union to perform to bitwise conversion
	union {
		double num;
		Value val;
	} convert;
	convert.val = val;
	return convert.num;
}